

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O1

bool __thiscall OpenMesh::IO::_OFFReader_::can_u_read(_OFFReader_ *this,istream *_is)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  char local_1028 [8];
  char line [4096];
  
  (this->options_).flags_ = 0;
  std::ios::widen((char)*(undefined8 *)(*(long *)_is + -0x18) + (char)_is);
  pcVar3 = local_1028;
  std::istream::getline((char *)_is,(long)pcVar3,'\0');
  lVar2 = *(long *)(_is + 8);
  if (((1 < lVar2) && (local_1028[0] == 'S')) && (local_1028[1] == 'T')) {
    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x40;
    pcVar3 = local_1028 + 2;
    lVar2 = lVar2 + -2;
  }
  if ((0 < lVar2) && (*pcVar3 == 'C')) {
    (this->options_).flags_ = (this->options_).flags_ | 0x220;
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
  }
  if ((0 < lVar2) && (*pcVar3 == 'N')) {
    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x10;
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
  }
  if ((lVar2 < 1) || (*pcVar3 != '4')) {
    bVar4 = 0;
  }
  else {
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
    bVar4 = 1;
  }
  if ((0 < lVar2) && (*pcVar3 == 'n')) {
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
    bVar4 = 1;
  }
  if ((((lVar2 < 3) || (*pcVar3 != 'O')) || (pcVar3[1] != 'F')) || (pcVar3[2] != 'F')) {
    bVar5 = false;
  }
  else {
    if (9 < lVar2) {
      iVar1 = strncmp(pcVar3 + 4,"BINARY",6);
      if (iVar1 == 0) {
        *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 1;
      }
    }
    bVar5 = (bool)(bVar4 ^ 1);
  }
  return bVar5;
}

Assistant:

bool _OFFReader_::can_u_read(std::istream& _is) const
{
  options_.cleanup();

  // read 1st line
  char line[LINE_LEN], *p;
  _is.getline(line, LINE_LEN);
  p = line;

  std::streamsize remainingChars = _is.gcount();

  bool vertexDimensionTooHigh = false;

  // check header: [ST][C][N][4][n]OFF BINARY

  if ( ( remainingChars > 1 ) && ( p[0] == 'S' && p[1] == 'T') )
  { options_ += Options::VertexTexCoord; p += 2; remainingChars -= 2; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'C') )
  { options_ += Options::VertexColor;
    options_ += Options::FaceColor; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'N') )
  { options_ += Options::VertexNormal; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && (p[0] == '4' ) )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'n') )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars < 3 ) || (!(p[0] == 'O' && p[1] == 'F' && p[2] == 'F')  ) )
    return false;

  p += 4;

  // Detect possible garbage and make sure, we don't have an underflow
  if ( remainingChars >= 4 )
    remainingChars -= 4;
  else
    remainingChars = 0;

  if ( ( remainingChars >= 6 ) && ( strncmp(p, "BINARY", 6) == 0 ) )
    options_+= Options::Binary;

  // vertex Dimensions != 3 are currently not supported
  if (vertexDimensionTooHigh)
    return false;

  return true;
}